

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O3

Promise<kj::AuthenticatedStream> __thiscall
kj::TlsContext::wrapServer(TlsContext *this,AuthenticatedStream *stream)

{
  Disposer *pDVar1;
  PromiseArena *pPVar2;
  OwnPromiseNode OVar3;
  undefined8 uVar4;
  AsyncIoStream *pAVar5;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar6;
  AsyncInputStream *pAVar7;
  PromiseBase PVar8;
  void *pvVar9;
  socklen_t *in_RCX;
  Own<kj::AsyncIoStream,_std::nullptr_t> *in_RDX;
  TransformPromiseNodeBase *pTVar10;
  TransformPromiseNodeBase *this_00;
  Own<kj::TlsConnection,_std::nullptr_t> OVar11;
  Promise<void> promise;
  Own<kj::TlsConnection,_std::nullptr_t> conn;
  String peerId;
  OwnPromiseNode local_100;
  undefined1 local_f8 [24];
  AsyncIoStream *pAStack_e0;
  Disposer *local_d8;
  AsyncIoStream *pAStack_d0;
  OwnPromiseNode local_c8;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aStack_c0;
  AsyncInputStream *local_b8;
  ForkHub<kj::_::Void> *local_a8;
  AsyncIoStream *pAStack_a0;
  OwnPromiseNode local_98;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aStack_90;
  AsyncInputStream *local_88;
  PromiseBase local_78;
  SourceLocation local_70;
  Disposer *local_58;
  AsyncIoStream *pAStack_50;
  ForkHub<kj::_::Void> *local_48;
  AsyncIoStream *pAStack_40;
  
  local_f8._16_8_ = (stream->stream).ptr;
  OVar11 = heap<kj::TlsConnection,kj::Own<kj::AsyncIoStream,decltype(nullptr)>,ssl_ctx_st*>
                     ((kj *)&local_a8,in_RDX,(ssl_ctx_st **)(local_f8 + 0x10));
  TlsConnection::accept((TlsConnection *)local_f8,(int)pAStack_a0,(sockaddr *)OVar11.ptr,in_RCX);
  if (*(char *)&(stream->peerIdentity).ptr == '\x01') {
    pDVar1 = (stream->peerIdentity).disposer;
    if (pDVar1 == (Disposer *)0x0) {
      local_70.fileName = (char *)0x0;
      local_f8._16_8_ = (SSL *)0x0;
      pAStack_e0 = (AsyncIoStream *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_70,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_70);
    }
    (*pDVar1->_vptr_Disposer[2])(&local_100,pDVar1,stream[1].stream.disposer);
    OVar3.ptr = local_100.ptr;
    pPVar2 = ((local_100.ptr)->super_PromiseArenaMember).arena;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_100.ptr - (long)pPVar2) < 0x28) {
      pvVar9 = operator_new(0x400);
      pTVar10 = (TransformPromiseNodeBase *)((long)pvVar9 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar10,&local_100,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:963:66)>
                 ::anon_class_1_0_00000001_for_func::operator());
      *(undefined ***)((long)pvVar9 + 0x3d8) = &PTR_destroy_00627dc8;
      *(void **)((long)pvVar9 + 0x3e0) = pvVar9;
    }
    else {
      ((local_100.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      pTVar10 = (TransformPromiseNodeBase *)&local_100.ptr[-3].super_PromiseArenaMember.arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar10,&local_100,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:963:66)>
                 ::anon_class_1_0_00000001_for_func::operator());
      OVar3.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_00627dc8;
      OVar3.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
    }
    local_f8._16_8_ = &DAT_0048a171;
    pAStack_e0 = (AsyncIoStream *)&DAT_0048a1d0;
    local_d8 = (Disposer *)&DAT_4c0000058b;
    local_98.ptr = &pTVar10->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_70,&local_98,(SourceLocation *)(local_f8 + 0x10));
    OVar3.ptr = local_98.ptr;
    local_c8.ptr = (PromiseNode *)local_70.fileName;
    if ((TransformPromiseNodeBase *)local_98.ptr != (TransformPromiseNodeBase *)0x0) {
      local_98.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
    }
    local_f8._16_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
    ;
    pAStack_e0 = (AsyncIoStream *)0x50951a;
    local_d8 = (Disposer *)0x27000003c3;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
              ((PromiseDisposer *)&local_70,&local_c8,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_f8,
               (SourceLocation *)(local_f8 + 0x10));
    uVar4 = local_f8._0_8_;
    local_f8._0_8_ = local_70.fileName;
    if ((PromiseArenaMember *)uVar4 != (PromiseArenaMember *)0x0) {
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
    }
    OVar3.ptr = local_c8.ptr;
    if (&(local_c8.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_c8.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
    }
    OVar3.ptr = local_100.ptr;
    if (&(local_100.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_100.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
    }
  }
  local_78.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  (**((in_RDX[1].ptr)->super_AsyncInputStream)._vptr_AsyncInputStream)(&local_98);
  uVar4 = local_f8._0_8_;
  local_48 = local_a8;
  pAStack_40 = pAStack_a0;
  local_f8._16_8_ = local_a8;
  pAStack_e0 = pAStack_a0;
  pAStack_a0 = (AsyncIoStream *)0x0;
  local_d8 = in_RDX[1].disposer;
  pAStack_d0 = in_RDX[1].ptr;
  in_RDX[1].ptr = (AsyncIoStream *)0x0;
  pPVar2 = *(PromiseArena **)(local_f8._0_8_ + 8);
  local_58 = local_d8;
  pAStack_50 = pAStack_d0;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_f8._0_8_ - (long)pPVar2) < 0x40) {
    pvVar9 = operator_new(0x400);
    pTVar10 = (TransformPromiseNodeBase *)((long)pvVar9 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar10,(OwnPromiseNode *)local_f8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:968:23)>
               ::anon_class_32_2_93c5e707_for_func::operator());
    *(undefined ***)((long)pvVar9 + 0x3c0) = &PTR_destroy_00627e20;
    *(Disposer **)((long)pvVar9 + 0x3f0) = local_58;
    *(AsyncIoStream **)((long)pvVar9 + 0x3f8) = pAStack_50;
    *(ForkHub<kj::_::Void> **)((long)pvVar9 + 0x3e0) = local_48;
    *(AsyncIoStream **)((long)pvVar9 + 1000) = pAStack_40;
    *(void **)((long)pvVar9 + 0x3c8) = pvVar9;
  }
  else {
    *(PromiseArena **)(local_f8._0_8_ + 8) = (PromiseArena *)0x0;
    pTVar10 = (TransformPromiseNodeBase *)(local_f8._0_8_ + -0x40);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar10,(OwnPromiseNode *)local_f8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:968:23)>
               ::anon_class_32_2_93c5e707_for_func::operator());
    ((PromiseArenaMember *)(uVar4 + -0x40))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_00627e20;
    ((PromiseArenaMember *)(uVar4 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)local_58;
    *(AsyncIoStream **)(uVar4 + -8) = pAStack_50;
    ((PromiseArenaMember *)(uVar4 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)local_48;
    *(AsyncIoStream **)(uVar4 + -0x18) = pAStack_40;
    *(PromiseArena **)(uVar4 + -0x38) = pPVar2;
  }
  pAVar7 = local_88;
  aVar6 = aStack_90;
  OVar3.ptr = local_98.ptr;
  pAStack_d0 = (AsyncIoStream *)0x0;
  pAStack_e0 = (AsyncIoStream *)0x0;
  local_c8.ptr = local_98.ptr;
  aStack_c0 = aStack_90;
  local_b8 = local_88;
  local_98.ptr = (PromiseNode *)0x0;
  aStack_90 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
  pPVar2 = (pTVar10->super_PromiseNode).super_PromiseArenaMember.arena;
  local_f8._8_8_ = pTVar10;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pTVar10 - (long)pPVar2) < 0x40) {
    pvVar9 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar9 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)(local_f8 + 8),
               kj::_::
               TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:971:13)>
               ::anon_class_24_1_66019b5b_for_errorHandler::operator());
    *(undefined ***)((long)pvVar9 + 0x3c0) = &PTR_destroy_00627e78;
    *(PromiseNode **)((long)pvVar9 + 1000) = OVar3.ptr;
    *(anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 *)((long)pvVar9 + 0x3f0) =
         aVar6;
    *(AsyncInputStream **)((long)pvVar9 + 0x3f8) = pAVar7;
    *(void **)((long)pvVar9 + 0x3c8) = pvVar9;
  }
  else {
    (pTVar10->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
    this_00 = pTVar10 + -2;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)(local_f8 + 8),
               kj::_::
               TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:971:13)>
               ::anon_class_24_1_66019b5b_for_errorHandler::operator());
    pTVar10[-2].super_PromiseNode.super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_00627e78;
    pTVar10[-1].super_PromiseNode.super_PromiseArenaMember.arena = (PromiseArena *)local_c8.ptr;
    pTVar10[-1].dependency.ptr = (PromiseNode *)aStack_c0;
    pTVar10[-1].continuationTracePtr = local_b8;
    pTVar10[-2].super_PromiseNode.super_PromiseArenaMember.arena = pPVar2;
  }
  PVar8.node.ptr = local_78.node.ptr;
  aStack_c0 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
  local_c8.ptr = (PromiseNode *)0x0;
  local_70.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
  ;
  local_70.function = "wrapServer";
  local_70.lineNumber = 0x3c8;
  local_70.columnNumber = 10;
  local_100.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)local_78.node.ptr,&local_100,&local_70);
  OVar3.ptr = local_100.ptr;
  if ((TransformPromiseNodeBase *)local_100.ptr != (TransformPromiseNodeBase *)0x0) {
    local_100.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  uVar4 = local_f8._8_8_;
  if ((TransformPromiseNodeBase *)local_f8._8_8_ != (TransformPromiseNodeBase *)0x0) {
    local_f8._8_8_ = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
  }
  pAVar5 = pAStack_d0;
  if (pAStack_d0 != (AsyncIoStream *)0x0) {
    pAStack_d0 = (AsyncIoStream *)0x0;
    (**local_d8->_vptr_Disposer)
              (local_d8,(pAVar5->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                        (long)&(pAVar5->super_AsyncInputStream)._vptr_AsyncInputStream);
  }
  pAVar5 = pAStack_e0;
  if (pAStack_e0 != (AsyncIoStream *)0x0) {
    pAStack_e0 = (AsyncIoStream *)0x0;
    (**(((ForkHubBase *)local_f8._16_8_)->super_PromiseArenaMember)._vptr_PromiseArenaMember)
              (local_f8._16_8_,
               (pAVar5->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&(pAVar5->super_AsyncInputStream)._vptr_AsyncInputStream);
  }
  aVar6 = aStack_90;
  OVar3.ptr = local_98.ptr;
  if (local_98.ptr != (PromiseNode *)0x0) {
    local_98.ptr = (PromiseNode *)0x0;
    aStack_90 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    (**local_88->_vptr_AsyncInputStream)(local_88,OVar3.ptr,1,aVar6,aVar6,0);
  }
  uVar4 = local_f8._0_8_;
  if ((PromiseArenaMember *)local_f8._0_8_ != (PromiseArenaMember *)0x0) {
    local_f8._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
  }
  pAVar5 = pAStack_a0;
  if (pAStack_a0 != (AsyncIoStream *)0x0) {
    pAStack_a0 = (AsyncIoStream *)0x0;
    (**(local_a8->super_ForkHubBase).super_PromiseArenaMember._vptr_PromiseArenaMember)
              (local_a8,(long)pAVar5 + *(long *)(*(long *)pAVar5 + -0x10));
  }
  return (Promise<kj::AuthenticatedStream>)(PromiseNode *)PVar8.node.ptr;
}

Assistant:

kj::Promise<kj::AuthenticatedStream> TlsContext::wrapServer(kj::AuthenticatedStream stream) {
  auto conn = kj::heap<TlsConnection>(kj::mv(stream.stream), reinterpret_cast<SSL_CTX*>(ctx));
  auto promise = conn->accept();
  KJ_IF_SOME(timeout, acceptTimeout) {
    promise = KJ_REQUIRE_NONNULL(timer).afterDelay(timeout).then([]() -> kj::Promise<void> {
      return KJ_EXCEPTION(DISCONNECTED, "timed out waiting for client during TLS handshake");
    }).exclusiveJoin(kj::mv(promise));
  }
  auto peerId = stream.peerIdentity->toString();
  return promise.then([conn=kj::mv(conn),innerId=kj::mv(stream.peerIdentity)]() mutable {
    auto id = conn->getIdentity(kj::mv(innerId));
    return kj::AuthenticatedStream { kj::mv(conn), kj::mv(id) };
  }).catch_([peerId=kj::mv(peerId)](kj::Exception&& e) -> kj::Promise<kj::AuthenticatedStream> {
    e.setDescription(kj::str(e.getDescription(), "; clientId = ", peerId));
    kj::throwFatalException(kj::mv(e));
  });
}